

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O3

MomentumType * __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::ConstParticleRef::getMomentum
          (MomentumType *__return_storage_ptr__,ConstParticleRef *this)

{
  double dVar1;
  int iVar2;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *pPVar3;
  long lVar4;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *pPVar5;
  MomentumType result;
  
  result.x = 0.0;
  result.y = 0.0;
  result.z = 0.0;
  pPVar3 = this->particles;
  iVar2 = this->idx;
  lVar4 = 0;
  pPVar5 = pPVar3;
  do {
    pPVar5 = (ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *)pPVar5->ps;
    (&result.x)[lVar4] =
         (((vector<double,_std::allocator<double>_> *)pPVar5)->
         super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_start[iVar2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar1 = *(double *)
           (ParticleTypes::types +
           (long)(pPVar3->typeIndex).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2] * 0x10);
  __return_storage_ptr__->x = dVar1 * result.x * 29979245800.0;
  __return_storage_ptr__->y = dVar1 * result.y * 29979245800.0;
  __return_storage_ptr__->z = result.z * 29979245800.0 * dVar1;
  return __return_storage_ptr__;
}

Assistant:

MomentumType getMomentum() const {
            MomentumType result;
            for (int d = 0; d < momentumDimension; d++)
                result[d] = particles.ps[d][idx];
            return result * Constants<GammaType>::c() * pica::ParticleTypes::types[particles.typeIndex[idx]].mass;
        }